

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReduceMinLayerParams::ReduceMinLayerParams
          (ReduceMinLayerParams *this,ReduceMinLayerParams *from)

{
  ReduceMinLayerParams *from_local;
  ReduceMinLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReduceMinLayerParams_006f7088;
  google::protobuf::RepeatedField<long>::RepeatedField(&this->axes_,&from->axes_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->keepdims_,&from->keepdims_,2);
  return;
}

Assistant:

ReduceMinLayerParams::ReduceMinLayerParams(const ReduceMinLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      axes_(from.axes_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&keepdims_, &from.keepdims_,
    static_cast<size_t>(reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_)) + sizeof(reduceall_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReduceMinLayerParams)
}